

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  cmTarget *this_00;
  cmLocalGenerator *pcVar1;
  unsigned_long uVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  pointer this_01;
  bool bVar3;
  bool bVar4;
  long lVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  reference ppVar6;
  vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_03;
  reference filename;
  ulong uVar7;
  string *psVar8;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *psVar9;
  reference ppcVar10;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_04;
  pointer pcVar11;
  char *pcVar12;
  cmLinkImplementationLibraries *this_05;
  mapped_type_conflict2 *pmVar13;
  reference ppVar14;
  size_type sVar15;
  iterator __first;
  iterator __last;
  reference pbVar16;
  mapped_type *pmVar17;
  cmLocalGenerator *pcVar18;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *this_06;
  reference name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_07;
  ConfigString *this_08;
  cmLocalGenerator *local_d18;
  byte local_ad1;
  allocator<char> local_ac1;
  string local_ac0;
  cmTarget *local_aa0;
  cmTarget *depTarget_1;
  iterator __end2_2;
  iterator __begin2_2;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range2_2;
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  *depName;
  iterator __end3_3;
  iterator __begin3_3;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *__range3_3;
  cmTarget *orderTarget;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_a50;
  cmLocalGenerator *local_a48;
  cmTarget *autogenTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a10;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_9f8;
  __single_object cc_2;
  cmCustomCommandLines local_9e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b8;
  string local_9a0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_980;
  basic_string_view<char,_std::char_traits<char>_> local_978;
  basic_string_view<char,_std::char_traits<char>_> local_968;
  basic_string_view<char,_std::char_traits<char>_> local_958;
  undefined1 local_948 [16];
  iterator local_938;
  undefined8 local_930;
  cmCustomCommandLine local_928;
  string local_910;
  string local_8f0;
  string local_8d0;
  undefined1 local_8b0 [8];
  string_view timestampFileName_1;
  undefined1 local_880 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempDepFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempTimestampFileName;
  string *config_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  ConfigString outputFileWithConfig;
  basic_string_view<char,_std::char_traits<char>_> local_7b8;
  basic_string_view<char,_std::char_traits<char>_> local_7a8;
  undefined1 local_798 [16];
  __node_base_ptr *local_788;
  undefined8 local_780;
  cmCustomCommandLine local_778;
  undefined1 local_760 [8];
  string depFileWithConfig;
  undefined1 local_720 [8];
  string timestampFileName;
  string depFileWithoutConfig;
  undefined1 local_6d8 [8];
  string timestampFileWithoutConfig;
  undefined1 local_6b0 [8];
  string configView;
  string depFile;
  string outputFile;
  string local_648;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_628;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_620;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_600;
  __single_object cc_3;
  string timestampTargetName;
  undefined1 local_5c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  cmTarget *timestampTarget;
  pair<const_cmGeneratorTarget_*const,_unsigned_long> *item_1;
  iterator __end3_2;
  iterator __begin3_2;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *__range3_2;
  cmGeneratorTarget *libTarget;
  cmLinkItem *item;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range5;
  cmLinkImplementationLibraries *libs;
  string *config;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  commonTargets;
  cmCustomCommandLines local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  undefined1 local_4b0 [8];
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_350;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_330;
  __single_object cc_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicDependencies;
  basic_string_view<char,_std::char_traits<char>_> local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  undefined1 local_2c0 [16];
  pointer *local_2b0;
  undefined8 local_2a8;
  cmCustomCommandLine local_2a0;
  string_view local_288;
  string_view local_278;
  string_view local_268;
  string local_258;
  string_view local_238;
  undefined1 local_228 [8];
  string timestampFileGenex;
  ConfigString timestampFile;
  cmTarget *depTarget;
  iterator __end2_1;
  iterator __begin2_1;
  set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_> *__range2_1;
  byte local_16a;
  allocator<char> local_169;
  undefined1 local_168 [6];
  bool usePRE_BUILD;
  undefined1 local_148 [8];
  cmCustomCommandLines commandLines;
  undefined1 local_128 [7];
  bool stdPipesUTF8;
  undefined1 local_108 [8];
  string tools;
  string autogenComment;
  pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *file;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  iterator __end4;
  iterator __begin4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  string local_80 [48];
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  bool useDepfile;
  cmQtAutoGenInitializer *this_local;
  
  cmMakefile::AddCMakeOutputFile(this->Makefile,&(this->AutogenTarget).InfoFile);
  autogenByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar3 = InitAutogenTarget::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     &autogenByproducts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&timestampByproducts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,&(this->Moc).super_GenVarsT,true);
    if (bVar3) {
      bVar4 = false;
      local_ad1 = 0;
      if ((this->CrossConfig & 1U) != 0) {
        (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_80);
        bVar4 = true;
        lVar5 = std::__cxx11::string::find((char *)local_80,0xf9cc0c);
        local_ad1 = 0;
        if (lVar5 != -1) {
          local_ad1 = this->UseBetterGraph ^ 0xff;
        }
      }
      if (bVar4) {
        std::__cxx11::string::~string(local_80);
      }
      if ((local_ad1 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_50,&(this->Moc).CompilationFileGenex);
      }
      else {
        this_02 = &(this->Moc).CompilationFile.Config;
        __end4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(this_02);
        p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(this_02);
        while (bVar4 = std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    *)&p), bVar4) {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   ::operator*(&__end4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_50,&ppVar6->second);
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
          ::operator++(&__end4);
        }
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&timestampByproducts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &(this->Moc).CompilationFileGenex);
    }
  }
  if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
    this_03 = &(this->Uic).UiHeaders;
    __end2 = std::
             vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this_03);
    file = (pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(this_03);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&file), bVar4) {
      filename = __gnu_cxx::
                 __normal_iterator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end2);
      AddGeneratedSource(this,&filename->first,&(this->Uic).super_GenVarsT,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&timestampByproducts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&filename->second);
      __gnu_cxx::
      __normal_iterator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::string::string((string *)(tools.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_108);
  if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_108,"MOC");
  }
  if (((this->Uic).super_GenVarsT.Enabled & 1U) != 0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_108," and ");
    }
    std::__cxx11::string::operator+=((string *)local_108,"UIC");
  }
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string_const&>
            ((string *)local_128,(char (*) [11])"Automatic ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (char (*) [13])0xfca717,psVar8);
  std::__cxx11::string::operator=((string *)(tools.field_2._M_local_buf + 8),(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_108);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"cmake_autogen",&local_169)
  ;
  AddCMakeProcessToCommandLines
            (this,&(this->AutogenTarget).InfoFile,(string *)local_168,
             (cmCustomCommandLines *)local_148);
  std::__cxx11::string::~string((string *)local_168);
  std::allocator<char>::~allocator(&local_169);
  local_16a = 0;
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(&__range2_1);
  lVar5 = std::__cxx11::string::find((char *)&__range2_1,0xfc8d0c);
  std::__cxx11::string::~string((string *)&__range2_1);
  if (lVar5 != -1) {
    local_16a = 1;
  }
  if ((local_16a & 1) != 0) {
    bVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->AutogenTarget).DependFiles);
    if (!bVar4) {
      local_16a = 0;
    }
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      local_16a = 0;
    }
  }
  if ((local_16a & 1) == 0) {
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
             *)&__range3_1);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ConfigsList);
      config = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->ConfigsList);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&config), bVar4) {
        pbVar16 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3_1);
        this_05 = cmGeneratorTarget::GetLinkImplementationLibraries(this->GenTarget,pbVar16,Link);
        if (this_05 != (cmLinkImplementationLibraries *)0x0) {
          __end5 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                             (&this_05->Libraries);
          item = (cmLinkItem *)
                 std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           (&this_05->Libraries);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                             *)&item), bVar4) {
            libTarget = (cmGeneratorTarget *)
                        __gnu_cxx::
                        __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                        ::operator*(&__end5);
            __range3_2 = *(map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                           **)&libTarget->ObjectDirectory;
            if (((cmGeneratorTarget *)__range3_2 != (cmGeneratorTarget *)0x0) &&
               (bVar4 = anon_unknown.dwarf_13825d1::StaticLibraryCycle
                                  (this->GenTarget,(cmGeneratorTarget *)__range3_2,pbVar16), !bVar4)
               ) {
              pmVar13 = std::
                        map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                        ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                      *)&__range3_1,(key_type *)&__range3_2);
              *pmVar13 = *pmVar13 + 1;
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
            ::operator++(&__end5);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      __end3_2 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::begin((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                          *)&__range3_1);
      item_1 = (pair<const_cmGeneratorTarget_*const,_unsigned_long> *)
               std::
               map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
               ::end((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                      *)&__range3_1);
      while (bVar4 = std::operator!=(&__end3_2,(_Self *)&item_1), bVar4) {
        ppVar14 = std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>
                  ::operator*(&__end3_2);
        uVar2 = ppVar14->second;
        sVar15 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->ConfigsList);
        if (uVar2 == sVar15) {
          std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                    (&(this->AutogenTarget).DependTargets,&ppVar14->first->Target);
        }
        std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>::
        operator++(&__end3_2);
      }
      std::
      map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~map((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
              *)&__range3_1);
    }
    dependencies.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_07 = &(this->AutogenTarget).DependFiles;
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(this_07);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_07);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(timestampTargetName.field_2._M_local_buf + 0xf));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5c0,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(timestampTargetName.field_2._M_local_buf + 0xf));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(timestampTargetName.field_2._M_local_buf + 0xf));
    if (bVar3) {
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[24]>
                ((string *)&cc_3,psVar8,(char (*) [24])"_autogen_timestamp_deps");
      std::make_unique<cmCustomCommand>();
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetWorkingDirectory(pcVar11,pcVar12);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_618,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5c0);
      cmCustomCommand::SetDepends(pcVar11,&local_618);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_618);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      cmCustomCommand::SetEscapeOldStyle(pcVar11,false);
      pcVar1 = this->LocalGen;
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                (&local_620,&local_600);
      dependencies.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmLocalGenerator::AddUtilityCommand(pcVar1,(string *)&cc_3,true,&local_620);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_620);
      pcVar1 = this->LocalGen;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                ((cmTarget **)&local_628,
                 (cmLocalGenerator **)
                 &dependencies.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmLocalGenerator::AddGeneratorTarget(pcVar1,&local_628);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_628);
      uVar7 = std::__cxx11::string::empty();
      this_01 = dependencies.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((uVar7 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,"FOLDER",
                   (allocator<char> *)(outputFile.field_2._M_local_buf + 0xf));
        cmTarget::SetProperty((cmTarget *)this_01,&local_648,&this->TargetsFolder);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator((allocator<char> *)(outputFile.field_2._M_local_buf + 0xf))
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5c0,(value_type *)&cc_3);
      AddAutogenExecutableToDependencies
                (this,&(this->Moc).super_GenVarsT,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5c0);
      AddAutogenExecutableToDependencies
                (this,&(this->Uic).super_GenVarsT,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5c0);
      std::__cxx11::string::string((string *)(depFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(configView.field_2._M_local_buf + 8));
      if (((this->MultiConfig & 1U) == 0) || ((this->UseBetterGraph & 1U) == 0)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_8b0,"timestamp");
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::basic_string_view<char,std::char_traits<char>>const&>
                  (&local_8d0,&(this->Dir).Build,(char (*) [2])0x105fca1,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_8b0);
        std::__cxx11::string::operator=
                  ((string *)(depFile.field_2._M_local_buf + 8),(string *)&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        cmStrCat<std::__cxx11::string&,char_const(&)[6]>
                  (&local_8f0,&(this->Dir).Build,(char (*) [6])"/deps");
        this_08 = &(this->AutogenTarget).DepFile;
        std::__cxx11::string::operator=((string *)this_08,(string *)&local_8f0);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::string::operator=
                  ((string *)(configView.field_2._M_local_buf + 8),(string *)this_08);
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::basic_string_view<char,std::char_traits<char>>const&>
                  (&local_910,&(this->Dir).RelativeBuild,(char (*) [2])0x105fca1,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_8b0);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)&local_910);
        std::__cxx11::string::~string((string *)&local_910);
        psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_978 = (basic_string_view<char,_std::char_traits<char>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_968,"-E");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_958,"touch")
        ;
        local_948 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(depFile.field_2._M_local_buf + 8));
        local_938 = &local_978;
        local_930 = 4;
        ilist._M_len = 4;
        ilist._M_array = local_938;
        cmMakeCommandLine(&local_928,ilist);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_148,
                   &local_928);
        cmCustomCommandLine::~cmCustomCommandLine(&local_928);
        AddGeneratedSource(this,(string *)((long)&depFile.field_2 + 8),&(this->Moc).super_GenVarsT,
                           false);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_6b0,"$<CONFIG>",
                   (allocator<char> *)(timestampFileWithoutConfig.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(timestampFileWithoutConfig.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_6d8,"timestamp_",
                   (allocator<char> *)(depFileWithoutConfig.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(depFileWithoutConfig.field_2._M_local_buf + 0xf));
        cmStrCat<std::__cxx11::string&,char_const(&)[7]>
                  ((string *)((long)&timestampFileName.field_2 + 8),&(this->Dir).Build,
                   (char (*) [7])"/deps_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_720,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6b0);
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&>
                  ((string *)((long)&depFileWithConfig.field_2 + 8),&(this->Dir).Build,
                   (char (*) [2])0x105fca1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
        std::__cxx11::string::operator=
                  ((string *)(depFile.field_2._M_local_buf + 8),
                   (string *)(depFileWithConfig.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(depFileWithConfig.field_2._M_local_buf + 8));
        cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((string *)local_760,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&timestampFileName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0);
        std::__cxx11::string::operator=
                  ((string *)(configView.field_2._M_local_buf + 8),(string *)local_760);
        psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        outputFileWithConfig.Config._M_h._M_single_bucket =
             (__node_base_ptr)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7b8,"-E");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7a8,"touch")
        ;
        local_798 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(depFile.field_2._M_local_buf + 8));
        local_788 = &outputFileWithConfig.Config._M_h._M_single_bucket;
        local_780 = 4;
        ilist_00._M_len = 4;
        ilist_00._M_array = (iterator)local_788;
        cmMakeCommandLine(&local_778,ilist_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_148,
                   &local_778);
        cmCustomCommandLine::~cmCustomCommandLine(&local_778);
        cmQtAutoGen::ConfigString::ConfigString((ConfigString *)&__range4_1);
        __end4_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->ConfigsList);
        config_1 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->ConfigsList);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&config_1);
          if (!bVar3) break;
          pbVar16 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&tempDepFile.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6d8,pbVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_880,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&timestampFileName.field_2 + 8),pbVar16);
          pmVar17 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&outputFileWithConfig.Default.field_2 + 8),pbVar16);
          std::__cxx11::string::operator=
                    ((string *)pmVar17,(string *)(tempDepFile.field_2._M_local_buf + 8));
          cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    ((string *)&timestampFileName_1._M_str,&(this->Dir).RelativeBuild,
                     (char (*) [2])0x105fca1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tempDepFile.field_2 + 8));
          pmVar17 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&(this->AutogenTarget).DepFileRuleName.Config,pbVar16);
          std::__cxx11::string::operator=((string *)pmVar17,(string *)&timestampFileName_1._M_str);
          std::__cxx11::string::~string((string *)&timestampFileName_1._M_str);
          pmVar17 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&(this->AutogenTarget).DepFile.Config,pbVar16);
          std::__cxx11::string::operator=((string *)pmVar17,(string *)local_880);
          std::__cxx11::string::~string((string *)local_880);
          std::__cxx11::string::~string((string *)(tempDepFile.field_2._M_local_buf + 8));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4_1);
        }
        AddGeneratedSource(this,(ConfigString *)&__range4_1,&(this->Moc).super_GenVarsT,false);
        cmQtAutoGen::ConfigString::~ConfigString((ConfigString *)&__range4_1);
        std::__cxx11::string::~string((string *)local_760);
        std::__cxx11::string::~string((string *)local_720);
        std::__cxx11::string::~string((string *)(timestampFileName.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6d8);
        std::__cxx11::string::~string((string *)local_6b0);
      }
      std::make_unique<cmCustomCommand>();
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator=
                (&local_600,&local_980);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_980);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      std::__cxx11::string::string
                ((string *)&local_9a0,(string *)(depFile.field_2._M_local_buf + 8));
      cmCustomCommand::SetOutputs(pcVar11,&local_9a0);
      std::__cxx11::string::~string((string *)&local_9a0);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      cmCustomCommand::SetByproducts(pcVar11,&local_9b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_9b8);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9d0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5c0);
      cmCustomCommand::SetDepends(pcVar11,&local_9d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_9d0);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      cmCustomCommandLines::cmCustomCommandLines(&local_9e8,(cmCustomCommandLines *)local_148);
      cmCustomCommand::SetCommandLines(pcVar11,&local_9e8);
      cmCustomCommandLines::~cmCustomCommandLines(&local_9e8);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetComment(pcVar11,pcVar12);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      cmCustomCommand::SetWorkingDirectory(pcVar11,pcVar12);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      cmCustomCommand::SetEscapeOldStyle(pcVar11,false);
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      cmCustomCommand::SetDepfile(pcVar11,(string *)((long)&configView.field_2 + 8));
      pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                          (&local_600);
      cmCustomCommand::SetStdPipesUTF8(pcVar11,true);
      pcVar1 = this->LocalGen;
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                (&cc_2,&local_600);
      cmLocalGenerator::AddCustomCommandToOutput(pcVar1,&cc_2,false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5c0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&depFile.field_2 + 8));
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_148);
      std::__cxx11::string::clear();
      std::__cxx11::string::~string((string *)(configView.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(depFile.field_2._M_local_buf + 8));
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_600);
      std::__cxx11::string::~string((string *)&cc_3);
    }
    std::make_unique<cmCustomCommand>();
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory(pcVar11,pcVar12);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a10,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&timestampByproducts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommand::SetByproducts(pcVar11,&local_a10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a10);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a28,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5c0);
    cmCustomCommand::SetDepends(pcVar11,&local_a28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a28);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    cmCustomCommandLines::cmCustomCommandLines
              ((cmCustomCommandLines *)&autogenTarget,(cmCustomCommandLines *)local_148);
    cmCustomCommand::SetCommandLines(pcVar11,(cmCustomCommandLines *)&autogenTarget);
    cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)&autogenTarget);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    cmCustomCommand::SetEscapeOldStyle(pcVar11,false);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_9f8);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetComment(pcVar11,pcVar12);
    pcVar1 = this->LocalGen;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_a50,&local_9f8);
    pcVar18 = (cmLocalGenerator *)
              cmLocalGenerator::AddUtilityCommand
                        (pcVar1,&(this->AutogenTarget).Name,true,&local_a50);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_a50)
    ;
    pcVar1 = this->LocalGen;
    local_a48 = pcVar18;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>(&orderTarget,&local_a48);
    cmLocalGenerator::AddGeneratorTarget
              (pcVar1,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &orderTarget);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
               &orderTarget);
    if (dependencies.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_d18 = local_a48;
    }
    else {
      local_d18 = (cmLocalGenerator *)
                  dependencies.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (((this->AutogenTarget).DependOrigin & 1U) != 0) {
      this_06 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      __end3_3 = std::
                 set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                 ::begin(this_06);
      depName = (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                 *)std::
                   set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
                   ::end(this_06);
      while( true ) {
        bVar3 = std::operator!=(&__end3_3,(_Self *)&depName);
        if (!bVar3) break;
        name = std::
               _Rb_tree_const_iterator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator*(&__end3_3);
        cmTarget::AddUtility((cmTarget *)local_d18,(string *)name,false,this->Makefile);
        std::
        _Rb_tree_const_iterator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::operator++(&__end3_3);
      }
    }
    psVar9 = &(this->AutogenTarget).DependTargets;
    __end2_2 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin
                         (psVar9);
    depTarget_1 = (cmTarget *)
                  std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end
                            (psVar9);
    while( true ) {
      bVar3 = std::operator!=(&__end2_2,(_Self *)&depTarget_1);
      if (!bVar3) break;
      ppcVar10 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end2_2);
      local_aa0 = *ppcVar10;
      psVar8 = cmTarget::GetName_abi_cxx11_(local_aa0);
      cmTarget::AddUtility((cmTarget *)local_d18,psVar8,false,this->Makefile);
      std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end2_2);
    }
    uVar7 = std::__cxx11::string::empty();
    pcVar1 = local_a48;
    if ((uVar7 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"FOLDER",&local_ac1);
      cmTarget::SetProperty((cmTarget *)pcVar1,&local_ac0,&this->TargetsFolder);
      std::__cxx11::string::~string((string *)&local_ac0);
      std::allocator<char>::~allocator(&local_ac1);
    }
    cmTarget::AddUtility(this->GenTarget->Target,&(this->AutogenTarget).Name,false,this->Makefile);
    if (((this->AutogenTarget).GlobalTarget & 1U) != 0) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&(this->AutogenTarget).Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_9f8)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5c0);
    goto LAB_0090d532;
  }
  psVar9 = &(this->AutogenTarget).DependTargets;
  __end2_1 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::begin(psVar9)
  ;
  depTarget = (cmTarget *)
              std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end(psVar9);
  while (bVar3 = std::operator!=(&__end2_1,(_Self *)&depTarget), bVar3) {
    ppcVar10 = std::_Rb_tree_const_iterator<cmTarget_*>::operator*(&__end2_1);
    this_00 = this->GenTarget->Target;
    psVar8 = cmTarget::GetName_abi_cxx11_(*ppcVar10);
    cmTarget::AddUtility(this_00,psVar8,false,this->Makefile);
    std::_Rb_tree_const_iterator<cmTarget_*>::operator++(&__end2_1);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->Uic).UiFilesNoOptions);
  if (bVar3) {
    bVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(&(this->Uic).UiFilesWithOptions);
    if (!bVar3) goto LAB_0090b5cf;
  }
  else {
LAB_0090b5cf:
    cmQtAutoGen::ConfigString::ConfigString((ConfigString *)((long)&timestampFileGenex.field_2 + 8))
    ;
    std::__cxx11::string::string((string *)local_228);
    local_268 = (string_view)::cm::operator____s("/autouic",8);
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              (&local_258,&(this->Dir).Build,(static_string_view *)&local_268);
    local_238 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_258);
    local_288 = (string_view)::cm::operator____s(".stamp",6);
    local_278 = local_288;
    ConfigFileNamesAndGenex
              (this,(ConfigString *)((long)&timestampFileGenex.field_2 + 8),(string *)local_228,
               local_238,local_288);
    std::__cxx11::string::~string((string *)&local_258);
    AddGeneratedSource(this,(ConfigString *)((long)&timestampFileGenex.field_2 + 8),
                       &(this->Uic).super_GenVarsT,false);
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    uicDependencies.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e0,"-E");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,"touch");
    local_2c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_228);
    local_2b0 = &uicDependencies.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2a8 = 4;
    ilist_01._M_len = 4;
    ilist_01._M_array = (iterator)local_2b0;
    cmMakeCommandLine(&local_2a0,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_148,
               &local_2a0);
    cmCustomCommandLine::~cmCustomCommandLine(&local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3,&(this->Uic).UiFilesNoOptions);
    this_04 = &(this->Uic).UiFilesWithOptions;
    __end3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(this_04);
    uiFile = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end(this_04);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                  *)&uiFile);
      if (!bVar3) break;
      cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::operator*(&__end3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3,
                  (value_type *)
                  cc_1._M_t.
                  super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
                  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::operator++(&__end3);
    }
    AddAutogenExecutableToDependencies
              (this,&(this->Uic).super_GenVarsT,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
    std::make_unique<cmCustomCommand>();
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    std::__cxx11::string::string((string *)&local_350,(string *)local_228);
    cmCustomCommand::SetOutputs(pcVar11,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_368,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    cmCustomCommand::SetDepends(pcVar11,&local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    cmCustomCommand::SetComment(pcVar11,"");
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory(pcVar11,pcVar12);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    cmCustomCommand::SetEscapeOldStyle(pcVar11,false);
    pcVar11 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                        (&local_330);
    cmCustomCommand::SetStdPipesUTF8(pcVar11,true);
    pcVar1 = this->LocalGen;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
               &cc.CMP0147Status,&local_330);
    cmLocalGenerator::AddCustomCommandToOutput
              (pcVar1,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                      &cc.CMP0147Status,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
               &cc.CMP0147Status);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_330)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    std::__cxx11::string::~string((string *)local_228);
    cmQtAutoGen::ConfigString::~ConfigString
              ((ConfigString *)((long)&timestampFileGenex.field_2 + 8));
  }
  cmCustomCommand::cmCustomCommand((cmCustomCommand *)local_4b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4c8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&timestampByproducts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCustomCommand::SetByproducts((cmCustomCommand *)local_4b0,&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  cmCustomCommandLines::cmCustomCommandLines(&local_4e0,(cmCustomCommandLines *)local_148);
  cmCustomCommand::SetCommandLines((cmCustomCommand *)local_4b0,&local_4e0);
  cmCustomCommandLines::~cmCustomCommandLines(&local_4e0);
  pcVar12 = (char *)std::__cxx11::string::c_str();
  cmCustomCommand::SetComment((cmCustomCommand *)local_4b0,pcVar12);
  cmMakefile::GetBacktrace
            ((cmMakefile *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmCustomCommand::SetBacktrace
            ((cmCustomCommand *)local_4b0,
             (cmListFileBacktrace *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&commonTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  pcVar12 = (char *)std::__cxx11::string::c_str();
  cmCustomCommand::SetWorkingDirectory((cmCustomCommand *)local_4b0,pcVar12);
  cmCustomCommand::SetStdPipesUTF8((cmCustomCommand *)local_4b0,true);
  cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_4b0,false);
  cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_4b0,true);
  cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_4b0);
  cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_4b0);
LAB_0090d532:
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_148);
  std::__cxx11::string::~string((string *)(tools.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&timestampByproducts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  bool const useDepfile = [this]() -> bool {
    auto const& gen = this->GlobalGen->GetName();
    return this->QtVersion >= IntegerVersion(5, 15) &&
      (gen.find("Ninja") != std::string::npos ||
       gen.find("Make") != std::string::npos);
  }();

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useDepfile) {
      if (this->CrossConfig &&
          this->GlobalGen->GetName().find("Ninja") != std::string::npos &&
          !this->UseBetterGraph) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories

  bool constexpr stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  AddCMakeProcessToCommandLines(this->AutogenTarget.InfoFile, "cmake_autogen",
                                commandLines);

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    cmTarget* timestampTarget = nullptr;
    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());
    if (useDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetDepends(dependencies);
      cc->SetEscapeOldStyle(false);
      timestampTarget = this->LocalGen->AddUtilityCommand(timestampTargetName,
                                                          true, std::move(cc));

      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);
      std::string outputFile;
      std::string depFile;
      // Create the custom command that outputs the timestamp file.
      if (this->MultiConfig && this->UseBetterGraph) {
        // create timestamp file with $<CONFIG> in the name so that
        // every cmake_autogen target has its own timestamp file
        std::string const configView = "$<CONFIG>";
        std::string const timestampFileWithoutConfig = "timestamp_";
        std::string const depFileWithoutConfig =
          cmStrCat(this->Dir.Build, "/deps_");
        std::string const timestampFileName =
          timestampFileWithoutConfig + configView;
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        auto const depFileWithConfig =
          cmStrCat(depFileWithoutConfig, configView);
        depFile = depFileWithConfig;
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

        ConfigString outputFileWithConfig;
        for (std::string const& config : this->ConfigsList) {
          auto tempTimestampFileName = timestampFileWithoutConfig + config;
          auto tempDepFile = depFileWithoutConfig + config;
          outputFileWithConfig.Config[config] = tempTimestampFileName;
          this->AutogenTarget.DepFileRuleName.Config[config] =
            cmStrCat(this->Dir.RelativeBuild, "/", tempTimestampFileName);
          this->AutogenTarget.DepFile.Config[config] = tempDepFile;
        }
        this->AddGeneratedSource(outputFileWithConfig, this->Moc);
      } else {
        cm::string_view const timestampFileName = "timestamp";
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        this->AutogenTarget.DepFile.Default =
          cmStrCat(this->Dir.Build, "/deps");
        depFile = this->AutogenTarget.DepFile.Default;
        this->AutogenTarget.DepFileRuleName.Default =
          cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));
        this->AddGeneratedSource(outputFile, this->Moc);
      }
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(depFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
      dependencies.clear();
      dependencies.emplace_back(std::move(outputFile));
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Order the autogen target(s) just before the original target.
    cmTarget* orderTarget = timestampTarget ? timestampTarget : autogenTarget;
    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        orderTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }

    // Add additional autogen target dependencies to autogen target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      orderTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}